

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_cc79b7::Target::DumpCompileData
          (Value *__return_storage_ptr__,Target *this,CompileData *cd)

{
  bool bVar1;
  ulong uVar2;
  Value *pVVar3;
  vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  *this_00;
  reference inc;
  vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar4;
  reference def;
  Value local_228;
  Value local_200;
  reference local_1d8;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pch;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_2;
  Value precompileHeaders;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *d;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_1;
  Value defines;
  IncludeEntry *i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  *__range2;
  Value includes;
  Value local_88;
  Value local_50;
  undefined1 local_21;
  CompileData *local_20;
  CompileData *cd_local;
  Target *this_local;
  Value *result;
  
  local_21 = 0;
  local_20 = cd;
  cd_local = (CompileData *)this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    Json::Value::Value(&local_50,&local_20->Language);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"language");
    Json::Value::operator=(pVVar3,&local_50);
    Json::Value::~Value(&local_50);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    DumpSysroot(&local_88,this,&local_20->Sysroot);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"sysroot");
    Json::Value::operator=(pVVar3,&local_88);
    Json::Value::~Value(&local_88);
  }
  bVar1 = std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&local_20->Flags);
  if (!bVar1) {
    DumpCommandFragments((Value *)&includes.limit_,this,&local_20->Flags);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"compileCommandFragments");
    Json::Value::operator=(pVVar3,(Value *)&includes.limit_);
    Json::Value::~Value((Value *)&includes.limit_);
  }
  bVar1 = std::
          vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
          ::empty(&local_20->Includes);
  if (!bVar1) {
    Json::Value::Value((Value *)&__range2,arrayValue);
    this_00 = &local_20->Includes;
    __end2 = std::
             vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
             ::begin(this_00);
    i = (IncludeEntry *)
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
        ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_(anonymous_namespace)::CompileData::IncludeEntry_*,_std::vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>_>
                                       *)&i), bVar1) {
      inc = __gnu_cxx::
            __normal_iterator<const_(anonymous_namespace)::CompileData::IncludeEntry_*,_std::vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>_>
            ::operator*(&__end2);
      DumpInclude((Value *)&defines.limit_,this,inc);
      Json::Value::append((Value *)&__range2,(Value *)&defines.limit_);
      Json::Value::~Value((Value *)&defines.limit_);
      __gnu_cxx::
      __normal_iterator<const_(anonymous_namespace)::CompileData::IncludeEntry_*,_std::vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>_>
      ::operator++(&__end2);
    }
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"includes");
    Json::Value::operator=(pVVar3,(Value *)&__range2);
    Json::Value::~Value((Value *)&__range2);
  }
  bVar1 = std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&local_20->Defines);
  if (!bVar1) {
    Json::Value::Value((Value *)&__range2_1,arrayValue);
    pvVar4 = &local_20->Defines;
    __end2_1 = std::
               vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(pvVar4);
    d = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::end(pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&d), bVar1) {
      def = __gnu_cxx::
            __normal_iterator<const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator*(&__end2_1);
      DumpDefine((Value *)&precompileHeaders.limit_,this,def);
      Json::Value::append((Value *)&__range2_1,(Value *)&precompileHeaders.limit_);
      Json::Value::~Value((Value *)&precompileHeaders.limit_);
      __gnu_cxx::
      __normal_iterator<const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2_1);
    }
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"defines");
    Json::Value::operator=(pVVar3,(Value *)&__range2_1);
    Json::Value::~Value((Value *)&__range2_1);
  }
  bVar1 = std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&local_20->PrecompileHeaders);
  if (!bVar1) {
    Json::Value::Value((Value *)&__range2_2,arrayValue);
    pvVar4 = &local_20->PrecompileHeaders;
    __end2_2 = std::
               vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(pvVar4);
    pch = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&pch), bVar1) {
      local_1d8 = __gnu_cxx::
                  __normal_iterator<const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator*(&__end2_2);
      DumpPrecompileHeader(&local_200,this,local_1d8);
      Json::Value::append((Value *)&__range2_2,&local_200);
      Json::Value::~Value(&local_200);
      __gnu_cxx::
      __normal_iterator<const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2_2);
    }
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"precompileHeaders");
    Json::Value::operator=(pVVar3,(Value *)&__range2_2);
    Json::Value::~Value((Value *)&__range2_2);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    DumpLanguageStandard(&local_228,this,&local_20->LanguageStandard);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"languageStandard");
    Json::Value::operator=(pVVar3,&local_228);
    Json::Value::~Value(&local_228);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpCompileData(CompileData const& cd)
{
  Json::Value result = Json::objectValue;

  if (!cd.Language.empty()) {
    result["language"] = cd.Language;
  }
  if (!cd.Sysroot.empty()) {
    result["sysroot"] = this->DumpSysroot(cd.Sysroot);
  }
  if (!cd.Flags.empty()) {
    result["compileCommandFragments"] = this->DumpCommandFragments(cd.Flags);
  }
  if (!cd.Includes.empty()) {
    Json::Value includes = Json::arrayValue;
    for (auto const& i : cd.Includes) {
      includes.append(this->DumpInclude(i));
    }
    result["includes"] = includes;
  }
  if (!cd.Defines.empty()) {
    Json::Value defines = Json::arrayValue;
    for (JBT<std::string> const& d : cd.Defines) {
      defines.append(this->DumpDefine(d));
    }
    result["defines"] = std::move(defines);
  }
  if (!cd.PrecompileHeaders.empty()) {
    Json::Value precompileHeaders = Json::arrayValue;
    for (JBT<std::string> const& pch : cd.PrecompileHeaders) {
      precompileHeaders.append(this->DumpPrecompileHeader(pch));
    }
    result["precompileHeaders"] = std::move(precompileHeaders);
  }
  if (!cd.LanguageStandard.Value.empty()) {
    result["languageStandard"] =
      this->DumpLanguageStandard(cd.LanguageStandard);
  }

  return result;
}